

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

void __thiscall clickhouse::SocketHolder::Close(SocketHolder *this)

{
  if (this->handle_ != -1) {
    close(this->handle_);
    this->handle_ = -1;
  }
  return;
}

Assistant:

void SocketHolder::Close() noexcept {
    if (handle_ != -1) {
#if defined(_win_)
        closesocket(handle_);
#else
        close(handle_);
#endif
        handle_ = -1;
    }
}